

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_list * filter_list(nbt_list *list,nbt_predicate_t predicate,void *aux)

{
  int *piVar1;
  nbt_node *pnVar2;
  undefined8 *puVar3;
  nbt_list *new_entry;
  nbt_node *new_node;
  nbt_list *p;
  list_head *pos;
  nbt_list *ret;
  void *aux_local;
  nbt_predicate_t predicate_local;
  nbt_list *list_local;
  
  if (list == (nbt_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xe7,
                  "struct nbt_list *filter_list(const struct nbt_list *, nbt_predicate_t, void *)");
  }
  list_local = (nbt_list *)malloc(0x18);
  if (list_local == (nbt_list *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
LAB_00105c77:
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      piVar1 = __errno_location();
      *piVar1 = -2;
    }
    nbt_free_list(list_local);
    list_local = (nbt_list *)0x0;
  }
  else {
    list_local->data = (nbt_node *)0x0;
    (list_local->entry).blink = &list_local->entry;
    (list_local->entry).flink = &list_local->entry;
    for (p = (nbt_list *)(list->entry).flink; p != (nbt_list *)&list->entry;
        p = (nbt_list *)(p->entry).blink) {
      pnVar2 = nbt_filter((nbt_node *)p[-1].entry.flink,predicate,aux);
      piVar1 = __errno_location();
      if (*piVar1 != 0) goto LAB_00105c77;
      if (pnVar2 != (nbt_node *)0x0) {
        puVar3 = (undefined8 *)malloc(0x18);
        if (puVar3 == (undefined8 *)0x0) {
          piVar1 = __errno_location();
          *piVar1 = -2;
          goto LAB_00105c77;
        }
        *puVar3 = pnVar2;
        list_add_tail((list_head *)(puVar3 + 1),&list_local->entry);
      }
    }
  }
  return list_local;
}

Assistant:

static struct nbt_list* filter_list(const struct nbt_list* list, nbt_predicate_t predicate, void* aux)
{
    assert(list);

    struct nbt_list* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, goto filter_error);

    ret->data = NULL;
    INIT_LIST_HEAD(&ret->entry);

    const struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* p = list_entry(pos, struct nbt_list, entry);

        nbt_node* new_node = nbt_filter(p->data, predicate, aux);

        if(errno != NBT_OK)  goto filter_error;
        if(new_node == NULL) continue;

        struct nbt_list* new_entry;
        CHECKED_MALLOC(new_entry, sizeof *new_entry, goto filter_error);

        new_entry->data = new_node;
        list_add_tail(&new_entry->entry, &ret->entry);
    }

    return ret;

filter_error:
    if(errno == NBT_OK)
        errno = NBT_EMEM;

    nbt_free_list(ret);
    return NULL;
}